

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O0

unsigned_long __thiscall
o3dgc::BinaryStream::ReadUInt32Bin(BinaryStream *this,unsigned_long *position)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  unsigned_long uVar5;
  byte *pbVar6;
  unsigned_long local_20;
  unsigned_long value;
  unsigned_long *position_local;
  BinaryStream *this_local;
  
  uVar4 = *position;
  uVar5 = Vector<unsigned_char>::GetSize(&this->m_stream);
  if (uVar4 < uVar5 - 4) {
    if (this->m_endianness == O3DGC_BIG_ENDIAN) {
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar1 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar2 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar3 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      local_20 = (ulong)*pbVar6 +
                 (long)(int)((uint)bVar3 << 8) +
                 (long)(int)((uint)bVar2 << 0x10) + (long)(int)((uint)bVar1 << 0x18);
    }
    else {
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar1 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar2 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      bVar3 = *pbVar6;
      uVar5 = *position;
      *position = uVar5 + 1;
      pbVar6 = Vector<unsigned_char>::operator[](&this->m_stream,uVar5);
      local_20 = (long)(int)((uint)*pbVar6 << 0x18) +
                 (long)(int)((uint)bVar3 << 0x10) + (long)(int)((uint)bVar2 << 8) + (ulong)bVar1;
    }
    return local_20;
  }
  __assert_fail("position < m_stream.GetSize() - 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcBinaryStream.h"
                ,0xf0,"unsigned long o3dgc::BinaryStream::ReadUInt32Bin(unsigned long &) const");
}

Assistant:

unsigned long           ReadUInt32Bin(unsigned long & position)  const
                                {
                                    assert(position < m_stream.GetSize() - 4);
                                    unsigned long value = 0;
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        value += (m_stream[position++]<<24);
                                        value += (m_stream[position++]<<16);
                                        value += (m_stream[position++]<<8);
                                        value += (m_stream[position++]);
                                    }
                                    else
                                    {
                                        value += (m_stream[position++]);
                                        value += (m_stream[position++]<<8);
                                        value += (m_stream[position++]<<16);
                                        value += (m_stream[position++]<<24);
                                    }
                                    return value;
                                }